

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode resolve_server(Curl_easy *data,connectdata *conn,_Bool *async)

{
  _Bool *async_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (((uint)conn->bits >> 7 & 1) == 0) {
    data_local._4_4_ = resolve_fresh(data,conn,async);
  }
  else {
    *async = false;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode resolve_server(struct Curl_easy *data,
                               struct connectdata *conn,
                               bool *async)
{
  DEBUGASSERT(conn);
  DEBUGASSERT(data);

  /* Resolve the name of the server or proxy */
  if(conn->bits.reuse) {
    /* We're reusing the connection - no need to resolve anything, and
       idnconvert_hostname() was called already in create_conn() for the reuse
       case. */
    *async = FALSE;
    return CURLE_OK;
  }

  return resolve_fresh(data, conn, async);
}